

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O0

void luaS_init(lua_State *L)

{
  global_State *pgVar1;
  global_State *pgVar2;
  stringtable *psVar3;
  TString **ppTVar4;
  TString *pTVar5;
  stringtable *tb;
  int j;
  int i;
  global_State *g;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  pgVar2 = L->l_G;
  psVar3 = &pgVar2->strt;
  ppTVar4 = (TString **)luaM_malloc_(L,0x400,0);
  psVar3->hash = ppTVar4;
  tablerehash(psVar3->hash,0,0x80);
  (pgVar2->strt).size = 0x80;
  pTVar5 = luaS_newlstr(L,"not enough memory",0x11);
  pgVar1->memerrmsg = pTVar5;
  luaC_fix(L,(GCObject *)pgVar1->memerrmsg);
  for (tb._4_4_ = 0; tb._4_4_ < 0x35; tb._4_4_ = tb._4_4_ + 1) {
    for (tb._0_4_ = 0; (int)tb < 2; tb._0_4_ = (int)tb + 1) {
      pgVar1->strcache[tb._4_4_][(int)tb] = pgVar1->memerrmsg;
    }
  }
  return;
}

Assistant:

void luaS_init (lua_State *L) {
  global_State *g = G(L);
  int i, j;
  stringtable *tb = &G(L)->strt;
  tb->hash = luaM_newvector(L, MINSTRTABSIZE, TString*);
  tablerehash(tb->hash, 0, MINSTRTABSIZE);  /* clear array */
  tb->size = MINSTRTABSIZE;
  /* pre-create memory-error message */
  g->memerrmsg = luaS_newliteral(L, MEMERRMSG);
  luaC_fix(L, obj2gco(g->memerrmsg));  /* it should never be collected */
  for (i = 0; i < STRCACHE_N; i++)  /* fill cache with valid strings */
    for (j = 0; j < STRCACHE_M; j++)
      g->strcache[i][j] = g->memerrmsg;
}